

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::OnI32ConstExpr(BinaryReaderIR *this,uint32_t value)

{
  Result RVar1;
  undefined1 local_a0 [128];
  
  GetLocation((Location *)(local_a0 + 0x10),this);
  Const::I32((Const *)(local_a0 + 0x30),value,(Location *)(local_a0 + 0x10));
  std::make_unique<wabt::ConstExpr,wabt::Const>((Const *)local_a0);
  local_a0._8_8_ = local_a0._0_8_;
  local_a0._0_8_ = (long *)0x0;
  RVar1 = AppendExpr(this,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)(local_a0 + 8)
                    );
  if ((long *)local_a0._8_8_ != (long *)0x0) {
    (**(code **)(*(long *)local_a0._8_8_ + 8))();
  }
  if ((long *)local_a0._0_8_ != (long *)0x0) {
    (**(code **)(*(long *)local_a0._0_8_ + 8))();
  }
  return (Result)RVar1.enum_;
}

Assistant:

Result BinaryReaderIR::OnI32ConstExpr(uint32_t value) {
  return AppendExpr(
      std::make_unique<ConstExpr>(Const::I32(value, GetLocation())));
}